

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
diffusion::to_vector_char
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *data,size_t size)

{
  allocator_type local_19;
  
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,size,&local_19);
  if (size != 0) {
    memmove((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start,data,size);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<char> to_vector_char(char const *data, std::size_t size) {
    std::vector<char> result(size);
    std::copy(data, data + size, result.data());
    return result;
}